

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void __thiscall
chaiscript::Module::apply<chaiscript::ChaiScript_Basic,chaiscript::detail::Dispatch_Engine>
          (Module *this,ChaiScript_Basic *t_eval,Dispatch_Engine *t_engine)

{
  pointer psVar1;
  pointer ppVar2;
  pointer conversion;
  pointer obj;
  
  std::
  for_each<__gnu_cxx::__normal_iterator<std::pair<chaiscript::Type_Info,std::__cxx11::string>const*,std::vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>>,chaiscript::Module::apply<chaiscript::detail::Dispatch_Engine,__gnu_cxx::__normal_iterator<std::pair<chaiscript::Type_Info,std::__cxx11::string>const*,std::vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>>>(__gnu_cxx::__normal_iterator<std::pair<chaiscript::Type_Info,std::__cxx11::string>const*,std::vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>>,__gnu_cxx::__normal_iterator<std::pair<chaiscript::Type_Info,std::__cxx11::string>const*,std::vector<std::pair<chaiscript::Type_Info,std::__cxx11::string>,std::allocator<std::pair<chaiscript::Type_Info,std::__cxx11::string>>>>,chaiscript::detail::Dispatch_Engine&)::_lambda(auto:1_const&)_1_>
            ((this->m_typeinfos).
             super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_typeinfos).
             super__Vector_base<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Type_Info,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_54a39814)t_engine);
  std::
  for_each<__gnu_cxx::__normal_iterator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>const*,std::vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>>,chaiscript::Module::apply<chaiscript::detail::Dispatch_Engine,__gnu_cxx::__normal_iterator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>const*,std::vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>>>(__gnu_cxx::__normal_iterator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>const*,std::vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>>,__gnu_cxx::__normal_iterator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>const*,std::vector<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>,std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,std::__cxx11::string>>>>,chaiscript::detail::Dispatch_Engine&)::_lambda(auto:1_const&)_1_>
            ((this->m_funcs).
             super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_funcs).
             super__Vector_base<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,(anon_class_8_1_54a39814)t_engine);
  apply_eval<chaiscript::ChaiScript_Basic,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((this->m_evals).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->m_evals).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,t_eval);
  conversion = (this->m_conversions).
               super__Vector_base<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->m_conversions).
           super__Vector_base<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>,_std::allocator<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (conversion != psVar1) {
    do {
      Type_Conversions::add_conversion(&t_engine->m_conversions,conversion);
      conversion = conversion + 1;
    } while (conversion != psVar1);
  }
  ppVar2 = (this->m_globals).
           super__Vector_base<std::pair<chaiscript::Boxed_Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Boxed_Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (obj = (this->m_globals).
             super__Vector_base<std::pair<chaiscript::Boxed_Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<chaiscript::Boxed_Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; obj != ppVar2; obj = obj + 1) {
    detail::Dispatch_Engine::add_global_const(t_engine,&obj->first,&obj->second);
  }
  return;
}

Assistant:

void apply(Eval &t_eval, Engine &t_engine) const {
      apply(m_typeinfos.begin(), m_typeinfos.end(), t_engine);
      apply(m_funcs.begin(), m_funcs.end(), t_engine);
      apply_eval(m_evals.begin(), m_evals.end(), t_eval);
      apply_single(m_conversions.begin(), m_conversions.end(), t_engine);
      apply_globals(m_globals.begin(), m_globals.end(), t_engine);
    }